

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

value value_copy(value v)

{
  size_t __n;
  void *__src;
  value in_RDI;
  value copy;
  size_t size;
  value in_stack_ffffffffffffffd8;
  value __dest;
  undefined8 local_8;
  
  __n = value_size(in_stack_ffffffffffffffd8);
  local_8 = value_alloc((size_t)in_stack_ffffffffffffffd8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    __dest = local_8;
    __src = value_data(in_RDI);
    memcpy(__dest,__src,__n);
  }
  return local_8;
}

Assistant:

value value_copy(value v)
{
	size_t size = value_size(v);

	value copy = value_alloc(size);

	if (copy == NULL)
	{
		return NULL;
	}

	memcpy(copy, value_data(v), size);

	return copy;
}